

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::parse<int,int,int>(semver *this,string_view str,range_set<int,_int,_int> *out)

{
  long lVar1;
  pointer ptVar2;
  iterator iVar3;
  token *ptVar4;
  errc eVar5;
  pointer ptVar6;
  from_chars_result fVar7;
  token_stream token_stream;
  undefined1 local_78 [8];
  pointer ptStack_70;
  iterator local_68;
  token *ptStack_60;
  token local_58;
  range_parser local_48;
  
  ptVar6 = (pointer)str._M_len;
  local_68._M_current = (token *)0x0;
  ptStack_60 = (token *)0x0;
  local_78 = (undefined1  [8])0x0;
  ptStack_70 = (pointer)0x0;
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_finish = (token *)0x0;
  local_48.stream.current = (size_t)this;
  local_48.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_start = ptVar6;
  if (this == (semver *)0x0) {
    eVar5 = 0;
  }
  else {
    do {
      fVar7 = detail::lexer::scan_token((lexer *)&local_48,(token_stream *)local_78);
      ptVar6 = (pointer)fVar7.super_from_chars_result.ptr;
      eVar5 = fVar7.super_from_chars_result.ec;
      if (eVar5 != 0) goto LAB_0010294b;
    } while (local_48.stream.tokens.
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_finish < local_48.stream.current);
  }
  local_58.type = eol;
  local_58.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  _M_u = (_Variadic_union<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)0x0;
  local_58.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  _M_index = '\0';
  local_58.lexeme =
       (char *)(&(local_48.stream.tokens.
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start)->type +
               (long)(token_type *)local_48.stream.current);
  if (local_68._M_current == ptStack_60) {
    std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
    _M_realloc_insert<semver::detail::token_const&>
              ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)&ptStack_70,
               local_68,&local_58);
  }
  else {
    lVar1 = (ulong)(uint5)local_58._3_5_ << 0x18;
    (local_68._M_current)->type = (char)lVar1;
    (local_68._M_current)->value = (value_t)(short)((ulong)lVar1 >> 8);
    *(int5 *)&(local_68._M_current)->field_0x3 = (int5)((ulong)lVar1 >> 0x18);
    (local_68._M_current)->lexeme = local_58.lexeme;
    local_68._M_current = local_68._M_current + 1;
  }
LAB_0010294b:
  ptVar4 = ptStack_60;
  iVar3._M_current = local_68._M_current;
  ptVar2 = ptStack_70;
  if (eVar5 == 0) {
    ptStack_70 = (pointer)0x0;
    local_68._M_current = (token *)0x0;
    ptStack_60 = (token *)0x0;
    local_48.stream.current = (size_t)local_78;
    local_48.stream.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_start = ptVar2;
    local_48.stream.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
    local_48.stream.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ptVar4;
    fVar7 = detail::range_parser::parse<int,int,int>
                      (&local_48,(range_set<int,_int,_int> *)str._M_str);
    ptVar6 = (pointer)fVar7.super_from_chars_result.ptr;
    eVar5 = fVar7.super_from_chars_result.ec;
    if (local_48.stream.tokens.
        super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.stream.tokens.
                      super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.stream.tokens.
                            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.stream.tokens.
                            super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (ptStack_70 != (pointer)0x0) {
    operator_delete(ptStack_70,(long)ptStack_60 - (long)ptStack_70);
  }
  fVar7.super_from_chars_result.ec = eVar5;
  fVar7.super_from_chars_result.ptr = (char *)ptVar6;
  fVar7.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar7.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, range_set<I1, I2, I3>& out) {
  detail::token_stream token_stream;
  const from_chars_result result =  detail::lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  return detail::range_parser{ std::move(token_stream) }.parse(out);
}